

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

size_t __thiscall clickhouse::BufferOutput::DoNext(BufferOutput *this,void **data,size_t len)

{
  long lVar1;
  size_type sVar2;
  uchar *puVar3;
  size_t in_RDX;
  undefined8 *in_RSI;
  size_type in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  size_type __new_size;
  
  lVar1 = *(long *)(in_RDI + 0x10);
  __new_size = in_RDI;
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)(in_RDI + 8));
  if (sVar2 < lVar1 + in_RDX) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(unaff_retaddr,__new_size);
  }
  puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1e7033);
  *in_RSI = puVar3 + *(long *)(in_RDI + 0x10);
  *(size_t *)(in_RDI + 0x10) = in_RDX + *(long *)(in_RDI + 0x10);
  return in_RDX;
}

Assistant:

size_t BufferOutput::DoNext(void** data, size_t len) {
    if (pos_ + len > buf_->size()) {
        buf_->resize(pos_ + len);
    }

    *data = buf_->data() + pos_;
    pos_ += len;

    return len;
}